

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::save(Args *this,ostream *out)

{
  long lVar1;
  char *in_RSI;
  long in_RDI;
  int len;
  undefined4 local_14;
  char *local_10;
  
  local_10 = in_RSI;
  std::ostream::write(in_RSI,in_RDI + 0x10c);
  std::ostream::write(local_10,in_RDI + 0x110);
  std::ostream::write(local_10,in_RDI + 0x114);
  std::ostream::write(local_10,in_RDI + 0x118);
  std::ostream::write(local_10,in_RDI + 0x11c);
  std::ostream::write(local_10,in_RDI + 0x128);
  std::ostream::write(local_10,in_RDI + 300);
  std::ostream::write(local_10,in_RDI + 0x130);
  std::ostream::write(local_10,in_RDI + 0x134);
  std::ostream::write(local_10,in_RDI + 0x108);
  std::ostream::write(local_10,in_RDI + 0x140);
  local_14 = std::__cxx11::string::size();
  std::ostream::write(local_10,(long)&local_14);
  lVar1 = std::__cxx11::string::c_str();
  std::ostream::write(local_10,lVar1);
  return;
}

Assistant:

void Args::save(std::ostream& out) {
  out.write((char*) &(dim), sizeof(int));
  out.write((char*) &(ws), sizeof(int));
  out.write((char*) &(epoch), sizeof(int));
  out.write((char*) &(minCount), sizeof(int));
  out.write((char*) &(neg), sizeof(int));
  out.write((char*) &(wordNgrams), sizeof(int));
  out.write((char*) &(loss), sizeof(loss_name));
  out.write((char*) &(model), sizeof(model_name));
  out.write((char*) &(bucket), sizeof(int));
  out.write((char*) &(lrUpdateRate), sizeof(int));
  out.write((char*) &(t), sizeof(double));
  
  int len = propsStr.size();
  out.write((char*) &len, sizeof(int));
  out.write(propsStr.c_str(), len);
}